

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt5a.cpp
# Opt level: O2

bool __thiscall
crnlib::dxt5_endpoint_optimizer::compute(dxt5_endpoint_optimizer *this,params *p,results *r)

{
  vector<unsigned_char> *this_00;
  vector<unsigned_int> *this_01;
  sparse_bit_array *this_02;
  byte bVar1;
  uint8 uVar2;
  byte bVar3;
  params *ppVar4;
  uint i_1;
  long lVar5;
  results *prVar6;
  uchar __tmp;
  uint i;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint j;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  bool bVar15;
  byte local_55;
  uint local_54;
  results *local_50;
  uint local_44;
  uint local_40;
  uint local_3c;
  vector<unsigned_char> *local_38;
  
  this->m_pParams = p;
  this->m_pResults = r;
  if (p->m_num_pixels == 0) {
    return false;
  }
  if (p->m_pPixels == (color_quad_u8 *)0x0) {
    bVar15 = false;
  }
  else {
    this_00 = &this->m_unique_values;
    local_50 = r;
    vector<unsigned_char>::resize(this_00,0,false);
    this_01 = &this->m_unique_value_weights;
    vector<unsigned_int>::resize(this_01,0,false);
    for (lVar5 = 0x14; lVar5 != 0x114; lVar5 = lVar5 + 1) {
      this->m_unique_value_map[lVar5 + -0x14] = -1;
    }
    for (uVar8 = 0; uVar7 = p->m_num_pixels, uVar8 < uVar7; uVar8 = uVar8 + 1) {
      bVar1 = p->m_pPixels[uVar8].field_0.c[p->m_comp_index];
      uVar7 = this->m_unique_value_map[bVar1];
      if (uVar7 == 0xffffffff) {
        uVar7 = (this->m_unique_values).m_size;
        this->m_unique_value_map[bVar1] = uVar7;
        local_55 = bVar1;
        vector<unsigned_char>::push_back(this_00,&local_55);
        local_3c = 0;
        vector<unsigned_int>::push_back(this_01,&local_3c);
      }
      this_01->m_p[uVar7] = this_01->m_p[uVar7] + 1;
    }
    uVar11 = (this->m_unique_values).m_size;
    if (uVar11 == 1) {
      local_50->m_block_type = '\0';
      local_50->m_reordered = false;
      local_50->m_error = 0;
      uVar2 = *this_00->m_p;
      local_50->m_first_endpoint = uVar2;
      local_50->m_second_endpoint = uVar2;
      memset(local_50->m_pSelectors,0,(ulong)uVar7);
    }
    else {
      vector<unsigned_char>::resize(&this->m_trial_selectors,uVar11,false);
      local_38 = &this->m_best_selectors;
      vector<unsigned_char>::resize(local_38,(this->m_unique_values).m_size,false);
      local_50->m_error = 0xffffffffffffffff;
      uVar7 = (this->m_unique_values).m_size;
      uVar9 = 1;
      for (uVar8 = 0; uVar8 < uVar7 - 1; uVar8 = uVar8 + 1) {
        bVar1 = this_00->m_p[uVar8];
        for (uVar12 = (ulong)uVar9; uVar12 < uVar7; uVar12 = uVar12 + 1) {
          evaluate_solution(this,(uint)bVar1,(uint)(this->m_unique_values).m_p[uVar12]);
          uVar7 = (this->m_unique_values).m_size;
        }
        uVar9 = uVar9 + 1;
      }
      prVar6 = this->m_pResults;
      if ((cCRNDXTQualityNormal < this->m_pParams->m_quality) && (prVar6->m_error != 0)) {
        this_02 = &this->m_flags;
        sparse_bit_array::resize(this_02,0x10000);
        local_50 = (results *)this_02;
        sparse_bit_array::clear_all_bits(this_02);
        bVar15 = this->m_pParams->m_quality == cCRNDXTQualityUber;
        iVar13 = (uint)bVar15 * 8 + 8;
        local_40 = (uint)!bVar15 << 3 | 0xfffffff0;
        local_44 = local_40;
        for (; prVar6 = this->m_pResults, (int)local_40 <= iVar13; local_40 = local_40 + 1) {
          local_54 = prVar6->m_first_endpoint + local_40;
          if (-1 < (int)local_54) {
            if (0xff < local_54) break;
            iVar14 = local_54 * 0x100;
            for (uVar7 = local_44; (int)uVar7 <= iVar13; uVar7 = uVar7 + 1) {
              uVar10 = (uint)this->m_pResults->m_second_endpoint;
              uVar9 = uVar7 + uVar10;
              if (-1 < (int)uVar9) {
                if (0xff < uVar9) break;
                uVar11 = uVar10 + iVar14 + uVar7;
                bVar15 = sparse_bit_array::get_bit((sparse_bit_array *)local_50,uVar11);
                if (!bVar15) {
                  bVar15 = sparse_bit_array::get_bit
                                     ((sparse_bit_array *)local_50,uVar9 * 0x100 | local_54);
                  if (!bVar15) {
                    sparse_bit_array::set_bit((sparse_bit_array *)local_50,uVar11);
                    evaluate_solution(this,local_54,uVar9);
                  }
                }
              }
            }
          }
        }
      }
      prVar6->m_reordered = false;
      bVar1 = prVar6->m_first_endpoint;
      bVar3 = prVar6->m_second_endpoint;
      if (bVar1 == bVar3) {
        for (uVar8 = 0; uVar8 < (this->m_best_selectors).m_size; uVar8 = uVar8 + 1) {
          local_38->m_p[uVar8] = '\0';
        }
      }
      else if (prVar6->m_block_type == '\0') {
        if (bVar1 <= bVar3) {
          prVar6->m_first_endpoint = bVar3;
          prVar6->m_second_endpoint = bVar1;
          this->m_pResults->m_reordered = true;
          for (uVar8 = 0; uVar8 < (this->m_best_selectors).m_size; uVar8 = uVar8 + 1) {
            local_38->m_p[uVar8] =
                 *(uchar *)((long)&g_eight_alpha_invert_table + (ulong)local_38->m_p[uVar8]);
          }
        }
      }
      else if (bVar3 < bVar1) {
        prVar6->m_first_endpoint = bVar3;
        prVar6->m_second_endpoint = bVar1;
        this->m_pResults->m_reordered = true;
        for (uVar8 = 0; uVar8 < (this->m_best_selectors).m_size; uVar8 = uVar8 + 1) {
          local_38->m_p[uVar8] =
               *(uchar *)((long)&g_six_alpha_invert_table + (ulong)local_38->m_p[uVar8]);
        }
      }
      for (uVar8 = 0; ppVar4 = this->m_pParams, uVar8 < ppVar4->m_num_pixels; uVar8 = uVar8 + 1) {
        this->m_pResults->m_pSelectors[uVar8] =
             (this->m_best_selectors).m_p
             [(uint)this->m_unique_value_map
                    [ppVar4->m_pPixels[uVar8].field_0.c[ppVar4->m_comp_index]]];
      }
    }
    bVar15 = true;
  }
  return bVar15;
}

Assistant:

bool dxt5_endpoint_optimizer::compute(const params& p, results& r)
    {
        m_pParams = &p;
        m_pResults = &r;

        if ((!p.m_num_pixels) || (!p.m_pPixels))
        {
            return false;
        }

        m_unique_values.resize(0);
        m_unique_value_weights.resize(0);

        for (uint i = 0; i < 256; i++)
        {
            m_unique_value_map[i] = -1;
        }

        for (uint i = 0; i < p.m_num_pixels; i++)
        {
            uint alpha = p.m_pPixels[i][p.m_comp_index];

            int index = m_unique_value_map[alpha];

            if (index == -1)
            {
                index = m_unique_values.size();

                m_unique_value_map[alpha] = index;

                m_unique_values.push_back(static_cast<uint8>(alpha));
                m_unique_value_weights.push_back(0);
            }

            m_unique_value_weights[index]++;
        }

        if (m_unique_values.size() == 1)
        {
            r.m_block_type = 0;
            r.m_reordered = false;
            r.m_error = 0;
            r.m_first_endpoint = m_unique_values[0];
            r.m_second_endpoint = m_unique_values[0];
            memset(r.m_pSelectors, 0, p.m_num_pixels);
            return true;
        }

        m_trial_selectors.resize(m_unique_values.size());
        m_best_selectors.resize(m_unique_values.size());

        r.m_error = cUINT64_MAX;

        for (uint i = 0; i < m_unique_values.size() - 1; i++)
        {
            const uint low_endpoint = m_unique_values[i];

            for (uint j = i + 1; j < m_unique_values.size(); j++)
            {
                const uint high_endpoint = m_unique_values[j];

                evaluate_solution(low_endpoint, high_endpoint);
            }
        }

        if ((m_pParams->m_quality >= cCRNDXTQualityBetter) && (m_pResults->m_error))
        {
            m_flags.resize(256 * 256);
            m_flags.clear_all_bits();

            const int cProbeAmount = (m_pParams->m_quality == cCRNDXTQualityUber) ? 16 : 8;

            for (int l_delta = -cProbeAmount; l_delta <= cProbeAmount; l_delta++)
            {
                const int l = m_pResults->m_first_endpoint + l_delta;
                if (l < 0)
                {
                    continue;
                }
                else if (l > 255)
                {
                    break;
                }
                const uint bit_index = l * 256;

                for (int h_delta = -cProbeAmount; h_delta <= cProbeAmount; h_delta++)
                {
                    const int h = m_pResults->m_second_endpoint + h_delta;
                    if (h < 0)
                    {
                        continue;
                    }
                    else if (h > 255)
                    {
                        break;
                    }

                    //if (m_flags.get_bit(bit_index + h))
                    //   continue;
                    if ((m_flags.get_bit(bit_index + h)) || (m_flags.get_bit(h * 256 + l)))
                    {
                        continue;
                    }

                    m_flags.set_bit(bit_index + h);

                    evaluate_solution(static_cast<uint>(l), static_cast<uint>(h));
                }
            }
        }

        m_pResults->m_reordered = false;
        if (m_pResults->m_first_endpoint == m_pResults->m_second_endpoint)
        {
            for (uint i = 0; i < m_best_selectors.size(); i++)
            {
                m_best_selectors[i] = 0;
            }
        }
        else if (m_pResults->m_block_type)
        {
            //if (l > h)
            //   eight alpha
            // else
            //   six alpha

            if (m_pResults->m_first_endpoint > m_pResults->m_second_endpoint)
            {
                std::swap(m_pResults->m_first_endpoint, m_pResults->m_second_endpoint);
                m_pResults->m_reordered = true;
                for (uint i = 0; i < m_best_selectors.size(); i++)
                {
                    m_best_selectors[i] = g_six_alpha_invert_table[m_best_selectors[i]];
                }
            }
        }
        else if (m_pResults->m_first_endpoint <= m_pResults->m_second_endpoint)
        {
            std::swap(m_pResults->m_first_endpoint, m_pResults->m_second_endpoint);
            m_pResults->m_reordered = true;
            for (uint i = 0; i < m_best_selectors.size(); i++)
            {
                m_best_selectors[i] = g_eight_alpha_invert_table[m_best_selectors[i]];
            }
        }

        for (uint i = 0; i < m_pParams->m_num_pixels; i++)
        {
            uint alpha = m_pParams->m_pPixels[i][m_pParams->m_comp_index];

            int index = m_unique_value_map[alpha];

            m_pResults->m_pSelectors[i] = m_best_selectors[index];
        }

        return true;
    }